

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
 duckdb::BindDecimalArithmetic<false>
           (ClientContext *context,ScalarFunction *bound_function,
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           *arguments)

{
  ulong uVar1;
  LogicalTypeId LVar2;
  undefined1 uVar3;
  uchar uVar4;
  uint8_t uVar5;
  PhysicalType PVar6;
  PhysicalType PVar7;
  size_type sVar8;
  pointer pEVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
  in_RDI;
  uint8_t scale_1;
  uint8_t width_1;
  LogicalType *argument_type;
  idx_t i_1;
  LogicalType result_type;
  uint8_t required_width;
  bool can_convert;
  uint8_t scale;
  uint8_t width;
  idx_t i;
  uint8_t max_width_over_scale;
  uint8_t max_scale;
  uint8_t max_width;
  templated_unique_single_t *bind_data;
  LogicalType *in_stack_00000498;
  reference in_stack_fffffffffffffe88;
  LogicalType *in_stack_fffffffffffffe90;
  LogicalType *this;
  reference in_stack_fffffffffffffe98;
  pointer in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar10;
  undefined1 in_stack_fffffffffffffedc;
  uchar in_stack_fffffffffffffedd;
  uchar in_stack_fffffffffffffede;
  byte in_stack_fffffffffffffedf;
  string *msg;
  undefined7 in_stack_ffffffffffffff00;
  uint8_t local_ba;
  ulong local_b0;
  LogicalType local_a8;
  byte local_8a;
  undefined1 local_89;
  undefined1 local_61 [34];
  undefined1 local_3f;
  uchar local_3e;
  uchar local_3d;
  ulong local_30;
  uchar local_24;
  uchar local_23;
  byte local_22;
  byte local_21;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  
  local_21 = 0;
  local_20 = in_RCX;
  make_uniq<duckdb::DecimalArithmeticBindData>();
  local_22 = 0;
  local_23 = '\0';
  local_24 = '\0';
  for (local_30 = 0; uVar1 = local_30,
      sVar8 = ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::size(local_20), uVar1 < sVar8; local_30 = local_30 + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe90);
    LVar2 = LogicalType::id(&pEVar9->return_type);
    if (LVar2 != UNKNOWN) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe90);
      uVar3 = LogicalType::GetDecimalProperties
                        ((LogicalType *)
                         CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,
                                           CONCAT15(in_stack_fffffffffffffedd,
                                                    CONCAT14(in_stack_fffffffffffffedc,
                                                             in_stack_fffffffffffffed8)))),
                         (uint8_t *)in_stack_fffffffffffffed0,(uint8_t *)in_stack_fffffffffffffec8);
      local_3f = uVar3;
      if (!(bool)uVar3) {
        local_89 = 1;
        params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x10);
        msg = (string *)local_61;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_61 + 1),"Could not convert type %s to a decimal.",
                   (allocator *)msg);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe90);
        LogicalType::ToString_abi_cxx11_(in_stack_00000498);
        InternalException::InternalException<std::__cxx11::string>
                  ((InternalException *)CONCAT17(uVar3,in_stack_ffffffffffffff00),msg,params);
        local_89 = 0;
        __cxa_throw(params,&InternalException::typeinfo,InternalException::~InternalException);
      }
      in_stack_fffffffffffffedf = MaxValue<unsigned_char>(local_3d,local_22);
      local_22 = in_stack_fffffffffffffedf;
      in_stack_fffffffffffffede = MaxValue<unsigned_char>(local_3e,local_23);
      local_23 = in_stack_fffffffffffffede;
      in_stack_fffffffffffffedd = MaxValue<unsigned_char>(local_3d - local_3e,local_24);
      local_24 = in_stack_fffffffffffffedd;
    }
  }
  uVar4 = MaxValue<unsigned_char>(local_23 + local_24,local_22);
  local_8a = uVar4;
  local_8a = NumericCast<unsigned_char,int,void>(0);
  uVar10 = CONCAT13(local_8a,(int3)in_stack_fffffffffffffed8);
  if ((0x12 < local_8a) && (local_22 < 0x13)) {
    in_stack_fffffffffffffed0 =
         unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
         ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                       *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffed0->check_overflow = true;
    local_8a = 0x12;
  }
  if (0x26 < local_8a) {
    in_stack_fffffffffffffec8 =
         unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
         ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                       *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffec8->check_overflow = true;
    local_8a = 0x26;
  }
  LogicalType::DECIMAL(in_stack_fffffffffffffedf,in_stack_fffffffffffffede);
  local_b0 = 0;
  do {
    sVar8 = ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    if (sVar8 <= local_b0) {
      LogicalType::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      local_21 = 1;
      LogicalType::~LogicalType((LogicalType *)0x1262b82);
      if ((local_21 & 1) == 0) {
        unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
        ::~unique_ptr((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                       *)0x1262b99);
      }
      return (unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
              )(__uniq_ptr_impl<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
                )in_RDI._M_t.
                 super___uniq_ptr_impl<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::DecimalArithmeticBindData_*,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
                 .super__Head_base<0UL,_duckdb::DecimalArithmeticBindData_*,_false>._M_head_impl;
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe90);
    this = &pEVar9->return_type;
    LogicalType::GetDecimalProperties
              ((LogicalType *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,
                                 CONCAT15(in_stack_fffffffffffffedd,CONCAT14(uVar4,uVar10)))),
               (uint8_t *)in_stack_fffffffffffffed0,(uint8_t *)in_stack_fffffffffffffec8);
    uVar5 = DecimalType::GetScale(in_stack_fffffffffffffe90);
    if (local_ba == uVar5) {
      PVar6 = LogicalType::InternalType(this);
      PVar7 = LogicalType::InternalType(&local_a8);
      if (PVar6 != PVar7) goto LAB_01262b06;
      in_stack_fffffffffffffe98 =
           vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)this,(size_type)in_stack_fffffffffffffe88
                     );
      LogicalType::operator=(in_stack_fffffffffffffe98,this);
    }
    else {
LAB_01262b06:
      this = in_stack_fffffffffffffe90;
      in_stack_fffffffffffffe88 =
           vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)this,(size_type)in_stack_fffffffffffffe88
                     );
      LogicalType::operator=(in_stack_fffffffffffffe98,this);
    }
    local_b0 = local_b0 + 1;
    in_stack_fffffffffffffe90 = this;
  } while( true );
}

Assistant:

unique_ptr<DecimalArithmeticBindData> BindDecimalArithmetic(ClientContext &context, ScalarFunction &bound_function,
                                                            vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = make_uniq<DecimalArithmeticBindData>();

	// get the max width and scale of the input arguments
	uint8_t max_width = 0, max_scale = 0, max_width_over_scale = 0;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i]->return_type.id() == LogicalTypeId::UNKNOWN) {
			continue;
		}
		uint8_t width, scale;
		auto can_convert = arguments[i]->return_type.GetDecimalProperties(width, scale);
		if (!can_convert) {
			throw InternalException("Could not convert type %s to a decimal.", arguments[i]->return_type.ToString());
		}
		max_width = MaxValue<uint8_t>(width, max_width);
		max_scale = MaxValue<uint8_t>(scale, max_scale);
		max_width_over_scale = MaxValue<uint8_t>(width - scale, max_width_over_scale);
	}
	D_ASSERT(max_width > 0);
	uint8_t required_width = MaxValue<uint8_t>(max_scale + max_width_over_scale, max_width);
	if (!IS_MODULO) {
		// for addition/subtraction, we add 1 to the width to ensure we don't overflow
		required_width = NumericCast<uint8_t>(required_width + 1);
		if (required_width > Decimal::MAX_WIDTH_INT64 && max_width <= Decimal::MAX_WIDTH_INT64) {
			// we don't automatically promote past the hugeint boundary to avoid the large hugeint performance penalty
			bind_data->check_overflow = true;
			required_width = Decimal::MAX_WIDTH_INT64;
		}
	}
	if (required_width > Decimal::MAX_WIDTH_DECIMAL) {
		// target width does not fit in decimal at all: truncate the scale and perform overflow detection
		bind_data->check_overflow = true;
		required_width = Decimal::MAX_WIDTH_DECIMAL;
	}
	// arithmetic between two decimal arguments: check the types of the input arguments
	LogicalType result_type = LogicalType::DECIMAL(required_width, max_scale);
	// we cast all input types to the specified type
	for (idx_t i = 0; i < arguments.size(); i++) {
		// first check if the cast is necessary
		// if the argument has a matching scale and internal type as the output type, no casting is necessary
		auto &argument_type = arguments[i]->return_type;
		uint8_t width, scale;
		argument_type.GetDecimalProperties(width, scale);
		if (scale == DecimalType::GetScale(result_type) && argument_type.InternalType() == result_type.InternalType()) {
			bound_function.arguments[i] = argument_type;
		} else {
			bound_function.arguments[i] = result_type;
		}
	}
	bound_function.return_type = result_type;
	return bind_data;
}